

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void TransformColor_SSE2(VP8LMultipliers *m,uint32_t *argb_data,int num_pixels)

{
  undefined1 (*pauVar1) [16];
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  undefined8 *puVar8;
  int in_EDX;
  long in_RSI;
  byte *in_RDI;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i out;
  __m128i I;
  __m128i H;
  __m128i G;
  __m128i F;
  __m128i E;
  __m128i D;
  __m128i C;
  __m128i B;
  __m128i A;
  __m128i in;
  int i;
  __m128i mask_rb;
  __m128i mask_ag;
  __m128i mults_b2;
  __m128i mults_rb;
  char in_stack_fffffffffffffd34;
  undefined1 in_stack_fffffffffffffd35;
  char in_stack_fffffffffffffd36;
  undefined1 in_stack_fffffffffffffd37;
  uint32_t *in_stack_fffffffffffffd38;
  VP8LMultipliers *in_stack_fffffffffffffd40;
  int local_21c;
  char local_1a8;
  undefined1 uStack_1a7;
  char cStack_1a6;
  undefined1 uStack_1a5;
  char cStack_1a4;
  undefined1 uStack_1a3;
  char cStack_1a2;
  undefined1 uStack_1a1;
  char cStack_1a0;
  undefined1 uStack_19f;
  char cStack_19e;
  undefined1 uStack_19d;
  char cStack_19c;
  undefined1 uStack_19b;
  char cStack_19a;
  undefined1 uStack_199;
  char local_a8;
  char cStack_a6;
  char cStack_a4;
  char cStack_a2;
  char cStack_a0;
  char cStack_9e;
  char cStack_9c;
  char cStack_9a;
  char local_98;
  char cStack_94;
  char cStack_90;
  char cStack_8c;
  
  uVar6 = (int)(short)((ushort)*in_RDI << 8) << 0xb |
          (uint)(int)(short)((ushort)in_RDI[1] << 8) >> 5 & 0xffff;
  auVar5._4_4_ = uVar6;
  auVar5._0_4_ = uVar6;
  auVar5._12_4_ = uVar6;
  auVar5._8_4_ = uVar6;
  iVar7 = (int)(short)((ushort)in_RDI[2] << 8) << 0xb;
  auVar4._4_4_ = iVar7;
  auVar4._0_4_ = iVar7;
  auVar4._12_4_ = iVar7;
  auVar4._8_4_ = iVar7;
  for (local_21c = 0; local_21c + 4 <= in_EDX; local_21c = local_21c + 4) {
    pauVar1 = (undefined1 (*) [16])(in_RSI + (long)local_21c * 4);
    uVar2 = *(ulong *)*pauVar1;
    uVar3 = *(ulong *)(*pauVar1 + 8);
    auVar9._8_8_ = uVar3 & 0xff00ff00ff00ff00;
    auVar9._0_8_ = uVar2 & 0xff00ff00ff00ff00;
    auVar9 = pshuflw(auVar9,auVar9,0xa0);
    auVar9 = pshufhw(auVar9,auVar9,0xa0);
    auVar9 = pmulhw(auVar9,auVar5);
    auVar10 = psllw(*pauVar1,ZEXT416(8));
    auVar10 = pmulhw(auVar10,auVar4);
    local_98 = auVar10[2];
    cStack_94 = auVar10[6];
    cStack_90 = auVar10[10];
    cStack_8c = auVar10[0xe];
    local_a8 = auVar9[0];
    cStack_a6 = auVar9[2];
    cStack_a4 = auVar9[4];
    cStack_a2 = auVar9[6];
    cStack_a0 = auVar9[8];
    cStack_9e = auVar9[10];
    cStack_9c = auVar9[0xc];
    cStack_9a = auVar9[0xe];
    in_stack_fffffffffffffd38 =
         (uint32_t *)
         (ulong)CONCAT16(cStack_a2,
                         (uint6)CONCAT14(cStack_94 + cStack_a4,
                                         (uint)CONCAT12(cStack_a6,
                                                        (ushort)(byte)(local_98 + local_a8))));
    in_stack_fffffffffffffd40 =
         (VP8LMultipliers *)
         (ulong)CONCAT16(cStack_9a,
                         (uint6)CONCAT14(cStack_8c + cStack_9c,
                                         (uint)CONCAT12(cStack_9e,
                                                        (ushort)(byte)(cStack_90 + cStack_a0))));
    local_1a8 = (char)uVar2;
    uStack_1a7 = (undefined1)(uVar2 >> 8);
    cStack_1a6 = (char)(uVar2 >> 0x10);
    uStack_1a5 = (undefined1)(uVar2 >> 0x18);
    cStack_1a4 = (char)(uVar2 >> 0x20);
    uStack_1a3 = (undefined1)(uVar2 >> 0x28);
    cStack_1a2 = (char)(uVar2 >> 0x30);
    uStack_1a1 = (undefined1)(uVar2 >> 0x38);
    cStack_1a0 = (char)uVar3;
    uStack_19f = (undefined1)(uVar3 >> 8);
    cStack_19e = (char)(uVar3 >> 0x10);
    uStack_19d = (undefined1)(uVar3 >> 0x18);
    cStack_19c = (char)(uVar3 >> 0x20);
    uStack_19b = (undefined1)(uVar3 >> 0x28);
    cStack_19a = (char)(uVar3 >> 0x30);
    uStack_199 = (undefined1)(uVar3 >> 0x38);
    in_stack_fffffffffffffd34 = cStack_19c - (cStack_8c + cStack_9c);
    in_stack_fffffffffffffd36 = cStack_19a - cStack_9a;
    puVar8 = (undefined8 *)(in_RSI + (long)local_21c * 4);
    *puVar8 = CONCAT17(uStack_1a1,
                       CONCAT16(cStack_1a2 - cStack_a2,
                                CONCAT15(uStack_1a3,
                                         CONCAT14(cStack_1a4 - (cStack_94 + cStack_a4),
                                                  CONCAT13(uStack_1a5,
                                                           CONCAT12(cStack_1a6 - cStack_a6,
                                                                    CONCAT11(uStack_1a7,
                                                                             local_1a8 -
                                                                             (local_98 + local_a8)))
                                                          )))));
    puVar8[1] = CONCAT17(uStack_199,
                         CONCAT16(in_stack_fffffffffffffd36,
                                  CONCAT15(uStack_19b,
                                           CONCAT14(in_stack_fffffffffffffd34,
                                                    CONCAT13(uStack_19d,
                                                             CONCAT12(cStack_19e - cStack_9e,
                                                                      CONCAT11(uStack_19f,
                                                                               cStack_1a0 -
                                                                               (cStack_90 +
                                                                               cStack_a0))))))));
    in_stack_fffffffffffffd35 = uStack_19b;
    in_stack_fffffffffffffd37 = uStack_199;
  }
  if (local_21c != in_EDX) {
    VP8LTransformColor_C
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               CONCAT13(in_stack_fffffffffffffd37,
                        CONCAT12(in_stack_fffffffffffffd36,
                                 CONCAT11(in_stack_fffffffffffffd35,in_stack_fffffffffffffd34))));
  }
  return;
}

Assistant:

static void TransformColor_SSE2(const VP8LMultipliers* WEBP_RESTRICT const m,
                                uint32_t* WEBP_RESTRICT argb_data,
                                int num_pixels) {
  const __m128i mults_rb = MK_CST_16(CST_5b(m->green_to_red_),
                                     CST_5b(m->green_to_blue_));
  const __m128i mults_b2 = MK_CST_16(CST_5b(m->red_to_blue_), 0);
  const __m128i mask_ag = _mm_set1_epi32((int)0xff00ff00);  // alpha-green masks
  const __m128i mask_rb = _mm_set1_epi32(0x00ff00ff);       // red-blue masks
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i in = _mm_loadu_si128((__m128i*)&argb_data[i]); // argb
    const __m128i A = _mm_and_si128(in, mask_ag);     // a   0   g   0
    const __m128i B = _mm_shufflelo_epi16(A, _MM_SHUFFLE(2, 2, 0, 0));
    const __m128i C = _mm_shufflehi_epi16(B, _MM_SHUFFLE(2, 2, 0, 0));  // g0g0
    const __m128i D = _mm_mulhi_epi16(C, mults_rb);    // x dr  x db1
    const __m128i E = _mm_slli_epi16(in, 8);           // r 0   b   0
    const __m128i F = _mm_mulhi_epi16(E, mults_b2);    // x db2 0   0
    const __m128i G = _mm_srli_epi32(F, 16);           // 0 0   x db2
    const __m128i H = _mm_add_epi8(G, D);              // x dr  x  db
    const __m128i I = _mm_and_si128(H, mask_rb);       // 0 dr  0  db
    const __m128i out = _mm_sub_epi8(in, I);
    _mm_storeu_si128((__m128i*)&argb_data[i], out);
  }
  // fallthrough and finish off with plain-C
  if (i != num_pixels) {
    VP8LTransformColor_C(m, argb_data + i, num_pixels - i);
  }
}